

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YP_md_get_ad_value(YPSpur *spur,int num)

{
  int iVar1;
  int ret;
  int len;
  YPSpur_msg msg;
  int num_local;
  YPSpur *spur_local;
  
  _ret = 1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x500;
  msg.pid._4_4_ = 0;
  msg._16_8_ = (BADTYPE)num;
  msg.data[3]._4_4_ = num;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)&ret);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    iVar1 = (*(spur->dev).recv)(&spur->dev,(YPSpur_msg *)&ret);
    if (iVar1 < 0) {
      spur->connection_error = 1;
      spur_local._4_4_ = -1;
    }
    else {
      spur_local._4_4_ = (int)(double)msg._16_8_;
    }
  }
  return spur_local._4_4_;
}

Assistant:

int YP_md_get_ad_value(YPSpur* spur, int num)
{
  YPSpur_msg msg;
  int len;
  int ret;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_GETAD;
  msg.cs = 0;
  msg.data[0] = (double)num;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  ret = (int)msg.data[0];
  return ret;
}